

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O0

bool __thiscall
google::protobuf::util::MessageDifferencer::CompareMapField
          (MessageDifferencer *this,Message *message1,Message *message2,int unpacked_any,
          FieldDescriptor *repeated_field,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  bool bVar1;
  bool bVar2;
  LogMessage *pLVar3;
  MapFieldBase *pMVar4;
  Descriptor *pDVar5;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  undefined1 local_128 [8];
  SpecificField specific_field;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  current_parent_fields;
  FieldDescriptor *val_des;
  FieldDescriptor *key_des;
  iterator local_90;
  Reflection *local_80;
  Reflection *reflection2;
  Reflection *reflection1;
  byte local_59;
  LogMessage local_58;
  Voidify local_41;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *local_40;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *parent_fields_local;
  FieldDescriptor *repeated_field_local;
  Message *pMStack_28;
  int unpacked_any_local;
  Message *message2_local;
  Message *message1_local;
  MessageDifferencer *this_local;
  
  local_40 = parent_fields;
  parent_fields_local =
       (vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
        *)repeated_field;
  repeated_field_local._4_4_ = unpacked_any;
  pMStack_28 = message2;
  message2_local = message1;
  message1_local = (Message *)this;
  bVar1 = FieldDescriptor::is_map(repeated_field);
  local_59 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer.cc"
               ,0x49b,"repeated_field->is_map()");
    local_59 = 1;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar3);
  }
  if ((local_59 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_58);
  }
  reflection2 = Message::GetReflection(message2_local);
  local_80 = Message::GetReflection(pMStack_28);
  pMVar4 = Reflection::GetMapData(reflection2,message2_local,(FieldDescriptor *)parent_fields_local)
  ;
  bVar2 = internal::MapFieldBase::IsMapValid(pMVar4);
  bVar1 = false;
  if (bVar2) {
    pMVar4 = Reflection::GetMapData(local_80,pMStack_28,(FieldDescriptor *)parent_fields_local);
    bVar2 = internal::MapFieldBase::IsMapValid(pMVar4);
    bVar1 = false;
    if ((bVar2) && (bVar1 = false, this->reporter_ == (Reporter *)0x0)) {
      local_90 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::util::MessageDifferencer::MapKeyComparator_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::MessageDifferencer::MapKeyComparator_const*>>>
                 ::find<google::protobuf::FieldDescriptor_const*>
                           ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::util::MessageDifferencer::MapKeyComparator_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::MessageDifferencer::MapKeyComparator_const*>>>
                             *)&this->map_field_key_comparator_,
                            (key_arg<const_google::protobuf::FieldDescriptor_*> *)
                            &parent_fields_local);
      _key_des = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::util::MessageDifferencer::MapKeyComparator_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_const_google::protobuf::util::MessageDifferencer::MapKeyComparator_*>_>_>
                 ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::util::MessageDifferencer::MapKeyComparator_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_const_google::protobuf::util::MessageDifferencer::MapKeyComparator_*>_>_>
                        *)&this->map_field_key_comparator_);
      bVar2 = absl::lts_20250127::container_internal::operator==(&local_90,(iterator *)&key_des);
      bVar1 = false;
      if ((bVar2) && (bVar1 = false, this->repeated_field_comparison_ == AS_LIST)) {
        bVar1 = this->field_comparator_kind_ == kFCDefault;
      }
    }
  }
  if (bVar1) {
    pDVar5 = FieldDescriptor::message_type((FieldDescriptor *)parent_fields_local);
    field = Descriptor::map_key(pDVar5);
    pDVar5 = FieldDescriptor::message_type((FieldDescriptor *)parent_fields_local);
    field_00 = Descriptor::map_value(pDVar5);
    std::
    vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
    ::vector((vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
              *)&specific_field.forced_compare_no_presence_,local_40);
    SpecificField::SpecificField((SpecificField *)local_128);
    local_128 = (undefined1  [8])message2_local;
    specific_field.message1 = pMStack_28;
    specific_field.message2._0_4_ = repeated_field_local._4_4_;
    specific_field._16_8_ = parent_fields_local;
    std::
    vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
    ::push_back((vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                 *)&specific_field.forced_compare_no_presence_,(SpecificField *)local_128);
    bVar1 = IsIgnored(this,message2_local,pMStack_28,field,
                      (vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                       *)&specific_field.forced_compare_no_presence_);
    if ((bVar1) ||
       (bVar1 = IsIgnored(this,message2_local,pMStack_28,field_00,
                          (vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                           *)&specific_field.forced_compare_no_presence_), bVar1)) {
      bVar1 = false;
    }
    else {
      this_local._7_1_ =
           CompareMapFieldByMapReflection
                     (this,message2_local,pMStack_28,repeated_field_local._4_4_,
                      (FieldDescriptor *)parent_fields_local,
                      (vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                       *)&specific_field.forced_compare_no_presence_,
                      (this->field_comparator_).default_impl);
      bVar1 = true;
    }
    std::
    vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
    ::~vector((vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
               *)&specific_field.forced_compare_no_presence_);
    if (bVar1) goto LAB_004df236;
  }
  this_local._7_1_ =
       CompareRepeatedRep(this,message2_local,pMStack_28,repeated_field_local._4_4_,
                          (FieldDescriptor *)parent_fields_local,local_40);
LAB_004df236:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool MessageDifferencer::CompareMapField(
    const Message& message1, const Message& message2, int unpacked_any,
    const FieldDescriptor* repeated_field,
    std::vector<SpecificField>* parent_fields) {
  ABSL_DCHECK(repeated_field->is_map());

  // the input FieldDescriptor is guaranteed to be repeated field.
  const Reflection* reflection1 = message1.GetReflection();
  const Reflection* reflection2 = message2.GetReflection();

  // When both map fields are on map, do not sync to repeated field.
  if (reflection1->GetMapData(message1, repeated_field)->IsMapValid() &&
      reflection2->GetMapData(message2, repeated_field)->IsMapValid() &&
      // TODO: Add support for reporter
      reporter_ == nullptr &&
      // Users didn't set custom map field key comparator
      map_field_key_comparator_.find(repeated_field) ==
          map_field_key_comparator_.end() &&
      // Users didn't set repeated field comparison
      repeated_field_comparison_ == AS_LIST &&
      // Users didn't set their own FieldComparator implementation
      field_comparator_kind_ == kFCDefault) {
    const FieldDescriptor* key_des = repeated_field->message_type()->map_key();
    const FieldDescriptor* val_des =
        repeated_field->message_type()->map_value();
    std::vector<SpecificField> current_parent_fields(*parent_fields);
    SpecificField specific_field;
    specific_field.message1 = &message1;
    specific_field.message2 = &message2;
    specific_field.unpacked_any = unpacked_any;
    specific_field.field = repeated_field;
    current_parent_fields.push_back(specific_field);
    if (!IsIgnored(message1, message2, key_des, current_parent_fields) &&
        !IsIgnored(message1, message2, val_des, current_parent_fields)) {
      return CompareMapFieldByMapReflection(
          message1, message2, unpacked_any, repeated_field,
          &current_parent_fields, field_comparator_.default_impl);
    }
  }

  return CompareRepeatedRep(message1, message2, unpacked_any, repeated_field,
                            parent_fields);
}